

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::BDPTIntegrator::Li
          (BDPTIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *param_5)

{
  float fVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  Array path;
  Array path_00;
  ulong uVar5;
  int t;
  BDPTIntegrator *pBVar6;
  uint uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [56];
  undefined1 auVar12 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar13 [56];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  SampledSpectrum SVar16;
  SampledSpectrum v;
  SampledSpectrum SVar17;
  optional<pbrt::Point2<float>_> pFilmNew;
  Float misWeight;
  BDPTIntegrator *local_f0;
  SampledWavelengths *local_e8;
  int local_dc;
  FilmHandle local_d8;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_d0;
  CameraHandle local_c8;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_c0;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  SampledSpectrum Lpath;
  uintptr_t local_58;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_50;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_48;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_40;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_38;
  
  path = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)this->maxDepth + 2);
  local_38.bits =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_40.bits =
       (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       .bits;
  iVar3 = GenerateCameraSubpath
                    ((Integrator *)this,ray,lambda,(SamplerHandle *)&local_38,scratchBuffer,
                     this->maxDepth + 2,(CameraHandle *)&local_40,path,this->regularize);
  path_00 = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)this->maxDepth + 1);
  local_48.bits =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_50.bits =
       (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       .bits;
  local_58 = (this->lightSampler).
             super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
             .bits;
  local_f0 = this;
  local_e8 = lambda;
  iVar4 = GenerateLightSubpath
                    ((Integrator *)this,lambda,(SamplerHandle *)&local_48,(CameraHandle *)&local_50,
                     scratchBuffer,this->maxDepth + 1,(path->field_2).ei.super_Interaction.time,
                     (LightSamplerHandle)&local_58,path_00,this->regularize);
  if (iVar3 < 1) {
    _local_b8 = ZEXT816(0);
  }
  else {
    _local_b8 = ZEXT816(0);
    auVar10 = ZEXT1664(_local_b8);
    pBVar6 = local_f0;
    t = 1;
    local_dc = iVar3;
    do {
      if (-1 < iVar4) {
        iVar3 = 0;
        do {
          auVar13 = in_ZMM1._8_56_;
          auVar11 = auVar10._8_56_;
          uVar7 = iVar3 + t;
          if ((1 < uVar7 && (iVar3 != 1 || t != 1)) && ((int)(uVar7 - 2) <= pBVar6->maxDepth)) {
            pFilmNew.set = false;
            misWeight = 0.0;
            local_c0.bits =
                 (pBVar6->lightSampler).
                 super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                 .bits;
            local_c8.
            super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
            .bits = (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                     )(pBVar6->super_RayIntegrator).super_ImageTileIntegrator.camera.
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      .bits;
            local_d0.bits =
                 (sampler->
                 super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            SVar16 = ConnectBDPT((Integrator *)pBVar6,local_e8,path_00,path,iVar3,t,
                                 (LightSamplerHandle *)&local_c0,&local_c8,
                                 (SamplerHandle *)&local_d0,&pFilmNew,&misWeight);
            in_ZMM1._0_8_ = SVar16.values.values._8_8_;
            in_ZMM1._8_56_ = auVar13;
            auVar10._0_8_ = SVar16.values.values._0_8_;
            auVar10._8_56_ = auVar11;
            auVar9 = auVar10._0_16_;
            auVar12 = in_ZMM1._0_16_;
            Lpath.values.values = (array<float,_4>)vunpcklpd_avx(auVar9,auVar12);
            if (pFilmNew.set == true) {
              if (local_f0->visualizeStrategies == false) {
                if (local_f0->visualizeWeights != true) goto LAB_00409a1b;
                auVar14 = ZEXT816(0) << 0x40;
                auVar15 = ZEXT816(0) << 0x40;
              }
              else {
                auVar14 = ZEXT816(0) << 0x40;
                auVar15 = ZEXT816(0) << 0x40;
                if ((misWeight != 0.0) || (NAN(misWeight))) {
                  auVar15._4_4_ = misWeight;
                  auVar15._0_4_ = misWeight;
                  auVar15._8_4_ = misWeight;
                  auVar15._12_4_ = misWeight;
                  auVar15 = vdivps_avx((undefined1  [16])Lpath.values.values,auVar15);
                  auVar14 = vshufpd_avx(auVar15,auVar15,1);
                }
              }
              if (local_f0->visualizeWeights == false) {
                in_ZMM1 = ZEXT1664(auVar14);
                auVar10 = ZEXT1664(auVar15);
              }
              SVar16.values.values._0_8_ = auVar10._0_8_;
              SVar16.values.values._8_8_ = in_ZMM1._0_8_;
              FilmHandle::AddSplat
                        ((local_f0->weightFilms).
                         super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>.
                         _M_impl.super__Vector_impl_data._M_start +
                         ((int)((uVar7 - 2) * (uVar7 + 3)) / 2 + iVar3),(Point2f *)&pFilmNew,SVar16,
                         local_e8);
              auVar10 = ZEXT1664(auVar9);
              in_ZMM1 = ZEXT1664(auVar12);
            }
LAB_00409a1b:
            pBVar6 = local_f0;
            if (t == 1) {
              if ((Lpath.values.values[0] == 0.0) && (!NAN(Lpath.values.values[0]))) {
                uVar2 = 0;
                while (uVar5 = uVar2, uVar5 != 3) {
                  fVar1 = Lpath.values.values[uVar5 + 1];
                  if ((fVar1 != 0.0) || (uVar2 = uVar5 + 1, NAN(fVar1))) break;
                }
                if (2 < uVar5) goto LAB_00409ab9;
              }
              if (pFilmNew.set == false) {
                LogFatal<char_const(&)[21]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                           ,0x8e6,"Check failed: %s",(char (*) [21])"pFilmNew.has_value()");
              }
              local_d8.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
                   *(TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> *)
                    (((local_f0->super_RayIntegrator).super_ImageTileIntegrator.camera.
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      .bits & 0xffffffffffff) + 0x340);
              v.values.values._0_8_ = auVar10._0_8_;
              v.values.values._8_8_ = in_ZMM1._0_8_;
              FilmHandle::AddSplat(&local_d8,(Point2f *)&pFilmNew,v,local_e8);
              pBVar6 = local_f0;
            }
            else {
              local_b8._0_4_ = (float)local_b8._0_4_ + Lpath.values.values[0];
              local_b8._4_4_ = (float)local_b8._4_4_ + Lpath.values.values[1];
              fStack_b0 = fStack_b0 + Lpath.values.values[2];
              fStack_ac = fStack_ac + Lpath.values.values[3];
              auVar10 = ZEXT1664(_local_b8);
            }
          }
LAB_00409ab9:
          bVar8 = iVar3 != iVar4;
          iVar3 = iVar3 + 1;
        } while (bVar8);
      }
      bVar8 = t != local_dc;
      t = t + 1;
    } while (bVar8);
  }
  auVar9 = vshufpd_avx(_local_b8,_local_b8,1);
  SVar17.values.values._0_8_ = local_b8;
  SVar17.values.values._8_8_ = auVar9._0_8_;
  return (SampledSpectrum)SVar17.values.values;
}

Assistant:

SampledSpectrum BDPTIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                   SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                   VisibleSurface *) const {
    // Trace the camera and light subpaths
    Vertex *cameraVertices = scratchBuffer.Alloc<Vertex[]>(maxDepth + 2);
    int nCamera = GenerateCameraSubpath(*this, ray, lambda, sampler, scratchBuffer,
                                        maxDepth + 2, camera, cameraVertices, regularize);
    Vertex *lightVertices = scratchBuffer.Alloc<Vertex[]>(maxDepth + 1);
    int nLight = GenerateLightSubpath(*this, lambda, sampler, camera, scratchBuffer,
                                      maxDepth + 1, cameraVertices[0].time(),
                                      lightSampler, lightVertices, regularize);

    SampledSpectrum L(0.f);
    // Execute all BDPT connection strategies
    for (int t = 1; t <= nCamera; ++t) {
        for (int s = 0; s <= nLight; ++s) {
            int depth = t + s - 2;
            if ((s == 1 && t == 1) || depth < 0 || depth > maxDepth)
                continue;
            // Execute the $(s, t)$ connection strategy and update _L_
            pstd::optional<Point2f> pFilmNew;
            Float misWeight = 0.f;
            SampledSpectrum Lpath =
                ConnectBDPT(*this, lambda, lightVertices, cameraVertices, s, t,
                            lightSampler, camera, sampler, &pFilmNew, &misWeight);
            PBRT_DBG("%s\n",
                     StringPrintf("Connect bdpt s: %d, t: %d, Lpath: %s, misWeight: %f\n",
                                  s, t, Lpath, misWeight)
                         .c_str());
            if (pFilmNew && (visualizeStrategies || visualizeWeights)) {
                SampledSpectrum value;
                if (visualizeStrategies)
                    value = misWeight == 0 ? SampledSpectrum(0.) : Lpath / misWeight;
                if (visualizeWeights)
                    value = Lpath;
                CHECK(pFilmNew.has_value());
                weightFilms[BufferIndex(s, t)].AddSplat(*pFilmNew, value, lambda);
            }
            if (t != 1)
                L += Lpath;
            else if (Lpath) {
                CHECK(pFilmNew.has_value());
                camera.GetFilm().AddSplat(*pFilmNew, Lpath, lambda);
            }
        }
    }

    return L;
}